

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O1

int CfdFreeBlockHandle(void *handle,void *block_handle)

{
  string local_40;
  
  cfd::Initialize();
  if (block_handle != (void *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BlockOpe","");
    cfd::capi::CheckBuffer(block_handle,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (*(long **)((long)block_handle + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)((long)block_handle + 0x18) + 8))();
      *(undefined8 *)((long)block_handle + 0x18) = 0;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BlockOpe","");
  cfd::capi::FreeBuffer(block_handle,&local_40,0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdFreeBlockHandle(void* handle, void* block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (block_handle != nullptr) {
      CheckBuffer(block_handle, kPrefixBlock);
      CfdCapiBlockData* data = static_cast<CfdCapiBlockData*>(block_handle);
      if (data->block != nullptr) {
        delete data->block;
        data->block = nullptr;
      }
    }
    FreeBuffer(block_handle, kPrefixBlock, sizeof(CfdCapiBlockData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}